

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int CVmObjVector::static_getp_generate(vm_val_t *retval,uint *in_argc)

{
  int iVar1;
  int32_t iVar2;
  vm_obj_id_t obj;
  CVmObject *pCVar3;
  vm_val_t *this;
  int *in_RSI;
  vm_val_t *in_RDI;
  int sent_argc;
  int pushed_argc;
  int i;
  vm_rcdesc rc;
  int fargc;
  CVmObjVector *vec;
  int32_t cnt;
  CVmFuncPtr funcdesc;
  vm_val_t *func;
  uint argc;
  vm_val_t *in_stack_ffffffffffffff28;
  CVmObject *in_stack_ffffffffffffff30;
  uint caller_ofs;
  vm_rcdesc *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint uVar4;
  uint uVar5;
  uint argc_00;
  vm_val_t *this_00;
  int iVar6;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  CVmFuncPtr local_40;
  vm_val_t *local_38;
  int local_1c;
  vm_val_t *local_10;
  
  if (in_RSI == (int *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = *in_RSI;
  }
  local_1c = iVar6;
  local_10 = in_RDI;
  if ((static_getp_generate(vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&static_getp_generate(vm_val_t*,unsigned_int*)::desc), iVar1 != 0)
     ) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&static_getp_generate::desc,2);
    __cxa_guard_release(&static_getp_generate(vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)in_stack_ffffffffffffff38,(uint *)in_stack_ffffffffffffff30,
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff28);
  if (iVar1 == 0) {
    local_38 = CVmStack::get(0);
    CVmFuncPtr::CVmFuncPtr(&local_40);
    iVar1 = CVmFuncPtr::set((CVmFuncPtr *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            (vm_val_t *)CONCAT44(in_stack_ffffffffffffff54,iVar6));
    if (iVar1 == 0) {
      err_throw(0);
    }
    CVmStack::get(1);
    iVar2 = vm_val_t::num_to_int((vm_val_t *)in_stack_ffffffffffffff30);
    if (iVar2 < 0) {
      err_throw(0);
    }
    this_00 = local_10;
    obj = create((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(size_t)in_stack_ffffffffffffff28);
    vm_val_t::set_obj(this_00,obj);
    pCVar3 = vm_objp(0);
    CVmStack::push(local_10);
    iVar1 = CVmFuncPtr::is_varargs((CVmFuncPtr *)0x34e3cb);
    if (iVar1 == 0) {
      uVar5 = CVmFuncPtr::get_max_argc((CVmFuncPtr *)in_stack_ffffffffffffff30);
    }
    else {
      uVar5 = 0xffffffff;
    }
    argc_00 = uVar5;
    CVmMetaclass::get_class_obj((CVmMetaclass *)CONCAT44(uVar5,in_stack_ffffffffffffff40));
    vm_rcdesc::vm_rcdesc
              ((vm_rcdesc *)CONCAT44(argc_00,in_stack_ffffffffffffff40),
               (char *)in_stack_ffffffffffffff38,
               (vm_obj_id_t)((ulong)in_stack_ffffffffffffff30 >> 0x20),
               (unsigned_short)((ulong)in_stack_ffffffffffffff30 >> 0x10),in_stack_ffffffffffffff28,
               0);
    for (iVar1 = 0; caller_ofs = (uint)((ulong)in_stack_ffffffffffffff30 >> 0x20), iVar1 < iVar2;
        iVar1 = iVar1 + 1) {
      this = CVmStack::push();
      vm_val_t::set_int(this,iVar1 + 1);
      if (((int)uVar5 < 0) || (uVar4 = uVar5, 1 < (int)uVar5)) {
        uVar4 = 1;
      }
      CVmRun::call_func_ptr
                ((CVmRun *)CONCAT44(uVar4,iVar6),this_00,argc_00,in_stack_ffffffffffffff38,
                 caller_ofs);
      CVmStack::discard(1 - uVar4);
      in_stack_ffffffffffffff38 = (vm_rcdesc *)(long)iVar1;
      in_stack_ffffffffffffff30 = pCVar3;
      CVmRun::get_r0();
      set_element((CVmObjVector *)in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28,
                  (vm_val_t *)0x34e4ee);
      set_element_count((CVmObjVector *)in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28)
      ;
    }
    CVmStack::discard(local_1c + 1);
  }
  return 1;
}

Assistant:

int CVmObjVector::static_getp_generate(VMG_ vm_val_t *retval, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the callback function argument */
    vm_val_t *func = G_stk->get(0);

    /* make sure it's a function; set up a header pointer if it is */
    CVmFuncPtr funcdesc;
    if (!funcdesc.set(vmg_ func))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the count */
    int32_t cnt = G_stk->get(1)->num_to_int(vmg0_);

    /* make sure it's not negative */
    if (cnt < 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* create the vector */
    retval->set_obj(CVmObjVector::create(vmg_ FALSE, cnt));
    CVmObjVector *vec = (CVmObjVector *)vm_objp(vmg_ retval->val.obj);
    
    /* push the new vector for gc protection */
    G_stk->push(retval);
    
    /* find out how many arguments the function wants */
    int fargc = funcdesc.is_varargs() ? -1 : funcdesc.get_max_argc();

    /* set up our recursive call descriptor */
    vm_rcdesc rc(vmg_ "Vector.generate",
                 CVmObjVector::metaclass_reg_->get_class_obj(vmg0_),
                 PROPIDX_generate, func, argc);

    /* generate the elements */
    for (int i = 0 ; i < cnt ; ++i)
    {
        /* push the callback arguments */
        const int pushed_argc = 1;
        G_stk->push()->set_int(i+1);
        
        /* adjust the arguments for what the callback actually wants */
        int sent_argc = fargc < 0 || fargc > pushed_argc ? pushed_argc : fargc;
        
        /* call the callback */
        G_interpreter->call_func_ptr(vmg_ func, sent_argc, &rc, 0);
        
        /* discard excess arguments */
        G_stk->discard(pushed_argc - sent_argc);
        
        /* add the result to the list */
        vec->set_element(i, G_interpreter->get_r0());
        vec->set_element_count(i+1);
    }

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}